

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_relaxed_filenames(char *map)

{
  int local_14;
  int i;
  char *map_local;
  
  for (local_14 = 0x21; local_14 < 0x30; local_14 = local_14 + 1) {
    map[local_14] = '\x01';
  }
  for (local_14 = 0x3a; local_14 < 0x42; local_14 = local_14 + 1) {
    map[local_14] = '\x01';
  }
  for (local_14 = 0x5b; local_14 < 0x5f; local_14 = local_14 + 1) {
    map[local_14] = '\x01';
  }
  map[0x60] = '\x01';
  for (local_14 = 0x7b; local_14 < 0x7f; local_14 = local_14 + 1) {
    map[local_14] = '\x01';
  }
  return;
}

Assistant:

static void
idr_relaxed_filenames(char *map)
{
	int i;

	for (i = 0x21; i <= 0x2F; i++)
		map[i] = 1;
	for (i = 0x3A; i <= 0x41; i++)
		map[i] = 1;
	for (i = 0x5B; i <= 0x5E; i++)
		map[i] = 1;
	map[0x60] = 1;
	for (i = 0x7B; i <= 0x7E; i++)
		map[i] = 1;
}